

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Header6.cpp
# Opt level: O3

void __thiscall KDIS::PDU::Header6::Encode(Header6 *this,KDataStream *stream)

{
  KDataStream::Write(stream,this->m_ui8ProtocolVersion);
  KDataStream::Write(stream,this->m_ui8ExerciseID);
  KDataStream::Write(stream,this->m_ui8PDUType);
  KDataStream::Write(stream,this->m_ui8ProtocolFamily);
  (*(this->m_TimeStamp).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_TimeStamp,stream);
  KDataStream::Write<unsigned_short>(stream,this->m_ui16PDULength);
  KDataStream::Write(stream,this->m_ui8Padding1);
  KDataStream::Write(stream,this->m_ui8Padding2);
  return;
}

Assistant:

void Header6::Encode( KDataStream & stream ) const
{
    stream << m_ui8ProtocolVersion
           << m_ui8ExerciseID
           << m_ui8PDUType
           << m_ui8ProtocolFamily
           << KDIS_STREAM m_TimeStamp
           << m_ui16PDULength
           << m_ui8Padding1
           << m_ui8Padding2;
}